

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::BranchLayerParams::SharedDtor(BranchLayerParams *this)

{
  NeuralNetwork *pNVar1;
  Arena *pAVar2;
  LogMessage *other;
  BranchLayerParams *pBVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  BranchLayerParams *local_10;
  BranchLayerParams *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x47b9);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pBVar3 = internal_default_instance();
  if ((this != pBVar3) && (pNVar1 = this->ifbranch_, pNVar1 != (NeuralNetwork *)0x0)) {
    NeuralNetwork::~NeuralNetwork(pNVar1);
    operator_delete(pNVar1,0x58);
  }
  pBVar3 = internal_default_instance();
  if ((this != pBVar3) && (pNVar1 = this->elsebranch_, pNVar1 != (NeuralNetwork *)0x0)) {
    NeuralNetwork::~NeuralNetwork(pNVar1);
    operator_delete(pNVar1,0x58);
  }
  return;
}

Assistant:

inline void BranchLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete ifbranch_;
  if (this != internal_default_instance()) delete elsebranch_;
}